

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O1

bool __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<long>::TryGetPrecomputedValue
          (PrecomputeVisitor<long> *this,shared_ptr<const_calc4::Operator> *op,long *dest)

{
  _func_int **pp_Var1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pp_Var1 = (this->super_OperatorVisitor)._vptr_OperatorVisitor;
  if (pp_Var1 == (_func_int **)0x0) {
    lVar2 = 0;
  }
  else {
    lVar2 = __dynamic_cast(pp_Var1,&Operator::typeinfo,&PrecomputedOperator::typeinfo,0);
  }
  if (lVar2 == 0) {
    lVar2 = 0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->context;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (((_Rb_tree_header *)&this_00->_M_use_count)->_M_header)._M_color =
             (((_Rb_tree_header *)&this_00->_M_use_count)->_M_header)._M_color + _S_black;
        UNLOCK();
      }
      else {
        (((_Rb_tree_header *)&this_00->_M_use_count)->_M_header)._M_color =
             (((_Rb_tree_header *)&this_00->_M_use_count)->_M_header)._M_color + _S_black;
      }
    }
  }
  if (lVar2 != 0) {
    (op->super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(*(long *)(lVar2 + 0x18) + 8);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return lVar2 != 0;
}

Assistant:

bool TryGetPrecomputedValue(const std::shared_ptr<const Operator>& op, TNumber* dest)
    {
        if (auto precomputed = std::dynamic_pointer_cast<const PrecomputedOperator>(op))
        {
            *dest = precomputed->GetValue<TNumber>();
            return true;
        }
        else
        {
            return false;
        }
    }